

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.h
# Opt level: O1

void __thiscall
CompilerContext::CompilerContext
          (CompilerContext *this,Allocator *allocator,int optimizationLevel,
          ArrayView<InplaceStr> activeImports)

{
  long lVar1;
  
  this->allocator = allocator;
  (this->outputCtx).outputBuf = (this->outputCtx).outputBufDef;
  (this->outputCtx).outputBufSize = 0x100;
  (this->outputCtx).outputBufPos = 0;
  (this->outputCtx).tempBuf = (this->outputCtx).tempBufDef;
  (this->outputCtx).tempBufSize = 0x100;
  (this->outputCtx).stream = (void *)0x0;
  (this->outputCtx).openStream = OutputContext::FileOpen;
  (this->outputCtx).writeStream = OutputContext::FileWrite;
  (this->outputCtx).closeStream = OutputContext::FileClose;
  ParseContext::ParseContext(&this->parseCtx,allocator,optimizationLevel,activeImports);
  ExpressionContext::ExpressionContext(&this->exprCtx,allocator,optimizationLevel);
  (this->instRegVmFinalizeCtx).ctx = &this->exprCtx;
  (this->instRegVmFinalizeCtx).locations.data = (SynBase **)0x0;
  (this->instRegVmFinalizeCtx).locations.max = 0;
  (this->instRegVmFinalizeCtx).locations.count = 0;
  (this->instRegVmFinalizeCtx).cmds.data = (RegVmCmd *)0x0;
  (this->instRegVmFinalizeCtx).cmds.max = 0;
  (this->instRegVmFinalizeCtx).cmds.count = 0;
  (this->instRegVmFinalizeCtx).constants.data = (uint *)0x0;
  (this->instRegVmFinalizeCtx).constants.max = 0;
  (this->instRegVmFinalizeCtx).constants.count = 0;
  (this->instRegVmFinalizeCtx).regKillInfo.data = (uchar *)0x0;
  (this->instRegVmFinalizeCtx).regKillInfo.max = 0;
  (this->instRegVmFinalizeCtx).regKillInfo.count = 0;
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&(this->instRegVmFinalizeCtx).fixupPoints.little[0].cmdIndex + lVar1) = 0;
    *(undefined8 *)((long)&(this->instRegVmFinalizeCtx).fixupPoints.little[0].target + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x200);
  (this->instRegVmFinalizeCtx).fixupPoints.allocator = allocator;
  (this->instRegVmFinalizeCtx).fixupPoints.data = (this->instRegVmFinalizeCtx).fixupPoints.little;
  (this->instRegVmFinalizeCtx).fixupPoints.count = 0;
  (this->instRegVmFinalizeCtx).fixupPoints.max = 0x20;
  (this->instRegVmFinalizeCtx).currentFunction = (VmFunction *)0x0;
  (this->instRegVmFinalizeCtx).currentBlock = (VmBlock *)0x0;
  this->optimizationLevel = optimizationLevel;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  this->synModule = (SynModule *)0x0;
  this->exprModule = (ExprModule *)0x0;
  this->exprMemoryLimit = 0;
  this->enableLogFiles = false;
  this->code = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->errorPos = (char *)0x0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->vmModule = (VmModule *)0x0;
  this->llvmModule = (LlvmModule *)0x0;
  this->regVmLoweredModule = (RegVmLoweredModule *)0x0;
  return;
}

Assistant:

CompilerContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): allocator(allocator), parseCtx(allocator, optimizationLevel, activeImports), exprCtx(allocator, optimizationLevel), instRegVmFinalizeCtx(exprCtx, allocator), optimizationLevel(optimizationLevel)
	{
		code = 0;

		moduleRoot = 0;

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		synModule = 0;

		exprModule = 0;
		exprMemoryLimit = 0;

		vmModule = 0;

		llvmModule = 0;

		regVmLoweredModule = 0;

		enableLogFiles = false;
	}